

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  size_type sVar2;
  _Alloc_hider _Var3;
  char cVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  char *pcVar8;
  undefined8 uVar9;
  int *piVar10;
  string *text;
  int prev_len;
  llama_token new_token_id;
  common_chat_templates_ptr chat_templates;
  int new_len;
  string piece;
  vector<int,_std::allocator<int>_> tokens;
  string prompt;
  llama_batch batch;
  LlamaData llama_data;
  string chat_template;
  Opt opt;
  char buf [256];
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  ulong uVar17;
  int local_494;
  int local_490;
  undefined4 local_48c;
  __uniq_ptr_impl<common_chat_templates,_common_chat_templates_deleter> local_488;
  int local_47c;
  undefined1 *local_478;
  undefined8 local_470;
  undefined1 local_468;
  undefined7 uStack_467;
  vector<int,_std::allocator<int>_> local_458;
  string local_438;
  long *local_418;
  undefined4 local_410;
  long local_408 [2];
  _union_1457 local_3f8;
  ulong uStack_3f0;
  ulong local_3e8;
  ulong uStack_3e0;
  ulong local_3d8;
  ulong uStack_3d0;
  ulong local_3c8;
  string local_3b8;
  undefined1 local_398 [24];
  pointer plStack_380;
  pointer local_378;
  pointer plStack_370;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_368;
  vector<char,_std::allocator<char>_> vStack_350;
  string local_338;
  long *local_318 [2];
  long local_308 [2];
  Opt local_2f8;
  _union_1457 local_1a8;
  undefined1 auStack_1a0 [9];
  undefined7 uStack_197;
  ulong uStack_190;
  ulong local_188;
  ulong uStack_180;
  ulong local_178;
  ios_base local_138 [24];
  undefined4 local_120;
  
  local_1a8.sa_handler = sigint_handler;
  sigemptyset((sigset_t *)auStack_1a0);
  local_120 = 0;
  uVar6 = 0;
  sigaction(2,(sigaction *)&local_1a8,(sigaction *)0x0);
  local_2f8.model_._M_dataplus._M_p = (pointer)&local_2f8.model_.field_2;
  local_2f8.model_._M_string_length = 0;
  local_2f8.model_.field_2._M_local_buf[0] = '\0';
  local_2f8.chat_template_file._M_dataplus._M_p = (pointer)&local_2f8.chat_template_file.field_2;
  local_2f8.chat_template_file._M_string_length = 0;
  local_2f8.chat_template_file.field_2._M_local_buf[0] = '\0';
  local_2f8.user._M_dataplus._M_p = (pointer)&local_2f8.user.field_2;
  local_2f8.user._M_string_length = 0;
  local_2f8.user.field_2._M_local_buf[0] = '\0';
  local_2f8.use_jinja = false;
  local_2f8.context_size = -1;
  local_2f8.ngl = -1;
  local_2f8.n_threads = -1;
  local_2f8.temperature = -1.0;
  local_2f8.verbose = false;
  local_2f8.context_size_default = -1;
  local_2f8.ngl_default = -1;
  local_2f8.n_threads_default = -1;
  local_2f8.temperature_default = -1.0;
  local_2f8.help = false;
  iVar5 = Opt::init(&local_2f8,(EVP_PKEY_CTX *)(ulong)(uint)argc);
  if (iVar5 == 0) {
    iVar5 = isatty(0);
    if (iVar5 == 0) {
      if (local_2f8.user._M_string_length != 0) {
        std::__cxx11::string::append((char *)&local_2f8.user);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::ostream::operator<<
                ((ostream *)&local_1a8,
                 *(streambuf **)(std::__cxx11::string::compare + *(long *)(std::cin + -0x18)));
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      std::ios_base::~ios_base(local_138);
      std::__cxx11::string::_M_append((char *)&local_2f8.user,local_398._0_8_);
      if ((string *)local_398._0_8_ != (string *)(local_398 + 0x10)) {
        operator_delete((void *)local_398._0_8_,(ulong)(local_398._16_8_ + 1));
      }
    }
    llama_log_set(log_callback,&local_2f8);
    local_368._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_368;
    local_378 = (pointer)0x0;
    plStack_370 = (pointer)0x0;
    local_398._16_8_ = (__uniq_ptr_impl<llama_context,_llama_context_deleter>)0x0;
    plStack_380 = (pointer)0x0;
    local_398._0_8_ = (__uniq_ptr_impl<llama_model,_llama_model_deleter>)0x0;
    local_398._8_8_ = (__uniq_ptr_impl<llama_sampler,_llama_sampler_deleter>)0x0;
    local_368._M_impl._M_node._M_size = 0;
    vStack_350.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    vStack_350.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    vStack_350.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_368._M_impl._M_node.super__List_node_base._M_prev =
         local_368._M_impl._M_node.super__List_node_base._M_next;
    iVar5 = LlamaData::init((LlamaData *)local_398,(EVP_PKEY_CTX *)&local_2f8);
    uVar6 = 1;
    if (iVar5 == 0) {
      local_490 = 0;
      uVar6 = llama_n_ctx(local_398._16_8_);
      std::vector<char,_std::allocator<char>_>::resize(&vStack_350,(ulong)uVar6);
      local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
      local_338._M_string_length = 0;
      local_338.field_2._M_local_buf[0] = '\0';
      if (local_2f8.chat_template_file._M_string_length != 0) {
        local_3f8.sa_handler = (__sighandler_t)0x0;
        uStack_3f0 = CONCAT44(uStack_3f0._4_4_,0xffffffff);
        local_3f8.sa_handler =
             (__sighandler_t)ggml_fopen(local_2f8.chat_template_file._M_dataplus._M_p,"r");
        _Var3._M_p = local_2f8.chat_template_file._M_dataplus._M_p;
        if (local_3f8.sa_handler == (__sighandler_t)0x0) {
          piVar10 = __errno_location();
          pcVar8 = strerror(*piVar10);
          printe("Error opening chat template file \'%s\': %s",_Var3._M_p,pcVar8);
          local_1a8.sa_handler = (__sighandler_t)(auStack_1a0 + 8);
          auStack_1a0._0_8_ = 0;
          auStack_1a0[8] = 0;
        }
        else {
          File::to_string_abi_cxx11_((string *)&local_1a8,(File *)&local_3f8);
        }
        File::~File((File *)&local_3f8);
        std::__cxx11::string::operator=((string *)&local_338,(string *)&local_1a8);
        if (local_1a8.sa_handler != (__sighandler_t)(auStack_1a0 + 8)) {
          operator_delete(local_1a8.sa_handler,CONCAT71(uStack_197,auStack_1a0[8]) + 1);
        }
      }
      auStack_1a0._0_8_ = 0;
      auStack_1a0[8] = 0;
      uStack_3f0 = 0;
      local_3e8 = local_3e8 & 0xffffffffffffff00;
      local_3f8.sa_handler = (__sighandler_t)&local_3e8;
      local_1a8.sa_handler = (__sighandler_t)(auStack_1a0 + 8);
      common_chat_templates_init
                ((llama_model *)&local_488,(string *)local_398._0_8_,&local_338,(string *)&local_1a8
                );
      if (local_3f8.sa_handler != (__sighandler_t)&local_3e8) {
        operator_delete(local_3f8.sa_handler,local_3e8 + 1);
      }
      if (local_1a8.sa_handler != (__sighandler_t)(auStack_1a0 + 8)) {
        operator_delete(local_1a8.sa_handler,CONCAT71(uStack_197,auStack_1a0[8]) + 1);
      }
      if (chat_loop(LlamaData&,Opt_const&)::stdout_a_terminal == '\0') {
        main_cold_1();
      }
      do {
        local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
        local_438._M_string_length = 0;
        local_438.field_2._M_local_buf[0] = '\0';
        while (local_2f8.user._M_string_length == 0) {
          if (read_user_input(std::__cxx11::string&)::prompt_prefix_env == '\0') {
            main_cold_2();
          }
          if (read_user_input(std::__cxx11::string&)::prompt_prefix == '\0') {
            main_cold_3();
          }
          pcVar8 = linenoise(read_user_input(std::__cxx11::string&)::prompt_prefix);
          sVar2 = local_438._M_string_length;
          iVar5 = 1;
          if (pcVar8 == (char *)0x0) {
LAB_001222be:
            local_494 = 0;
            goto LAB_00122415;
          }
          strlen(pcVar8);
          std::__cxx11::string::_M_replace((ulong)&local_438,0,(char *)sVar2,(ulong)pcVar8);
          iVar7 = std::__cxx11::string::compare((char *)&local_438);
          if (iVar7 == 0) {
            free(pcVar8);
            goto LAB_001222be;
          }
          if ((char *)local_438._M_string_length != (char *)0x0) {
            linenoiseHistoryAdd(pcVar8);
            free(pcVar8);
            goto LAB_00121ec6;
          }
          free(pcVar8);
        }
        std::__cxx11::string::_M_assign((string *)&local_438);
LAB_00121ec6:
        cVar4 = chat_loop(LlamaData&,Opt_const&)::stdout_a_terminal;
        text = &local_2f8.user;
        if (local_2f8.user._M_string_length == 0) {
          text = &local_438;
        }
        add_message("user",text,(LlamaData *)local_398);
        iVar5 = apply_chat_template_with_error_handling
                          ((common_chat_templates *)
                           local_488._M_t.
                           super__Tuple_impl<0UL,_common_chat_templates_*,_common_chat_templates_deleter>
                           .super__Head_base<0UL,_common_chat_templates_*,_false>._M_head_impl,
                           (LlamaData *)local_398,true,&local_47c,local_2f8.use_jinja);
        if (iVar5 < 0) {
          iVar5 = 1;
          local_494 = 1;
        }
        else {
          local_418 = local_408;
          std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                    ((string *)&local_418,
                     vStack_350.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start + local_490,
                     vStack_350.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start + local_47c);
          local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
          local_3b8._M_string_length = 0;
          local_3b8.field_2._M_local_buf[0] = '\0';
          if (cVar4 != '\0') {
            printf("\x1b[33m");
          }
          uVar9 = llama_model_get_vocab(local_398._0_8_);
          local_458.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          local_458.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          local_458.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          iVar5 = llama_kv_self_used_cells(local_398._16_8_);
          iVar7 = llama_tokenize(uVar9,local_418,local_410,0,0,iVar5 == 0,1);
          std::vector<int,_std::allocator<int>_>::resize(&local_458,(long)-iVar7);
          iVar5 = llama_tokenize(uVar9,local_418,local_410,
                                 local_458.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start,
                                 (ulong)((long)local_458.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_finish -
                                        (long)local_458.
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_start) >> 2,iVar5 == 0,1);
          if (iVar5 < 0) {
            pcVar8 = "failed to tokenize the prompt\n";
LAB_001222fc:
            bVar1 = false;
            printe(pcVar8);
          }
          else {
            if (iVar7 < 1) {
              llama_batch_get_one(&local_3f8,
                                  local_458.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start,
                                  (ulong)((long)local_458.
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_finish -
                                         (long)local_458.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_start) >> 2);
              while( true ) {
                iVar5 = llama_n_ctx(local_398._16_8_);
                iVar7 = llama_kv_self_used_cells(local_398._16_8_);
                if (iVar5 < iVar7 + local_3f8._0_4_) {
                  puts("\x1b[0m");
                  printe("context size exceeded\n");
                }
                uVar11 = local_3f8._0_4_;
                uVar12 = (undefined4)uStack_3f0;
                uVar13 = (undefined4)local_3e8;
                uVar14 = (undefined4)uStack_3e0;
                uVar15 = (undefined4)local_3d8;
                uVar16 = (undefined4)uStack_3d0;
                uVar17 = local_3c8;
                iVar5 = llama_decode(local_398._16_8_);
                if (iVar5 != 0) {
                  pcVar8 = "failed to decode\n";
                  goto LAB_001222fc;
                }
                local_48c = llama_sampler_sample(local_398._8_8_,local_398._16_8_,0xffffffff);
                cVar4 = llama_vocab_is_eog(uVar9);
                if (cVar4 != '\0') {
                  printf("\x1b[0m");
                  bVar1 = true;
                  goto LAB_00122303;
                }
                local_470 = 0;
                local_468 = 0;
                local_478 = &local_468;
                uVar6 = llama_token_to_piece
                                  (uVar9,local_48c,&local_1a8,0x100,0,1,uVar11,uVar12,uVar13,uVar14,
                                   uVar15,uVar16,uVar17);
                if ((int)uVar6 < 0) break;
                local_318[0] = local_308;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_318,&local_1a8,(long)&local_1a8 + (ulong)uVar6);
                std::__cxx11::string::operator=((string *)&local_478,(string *)local_318);
                if (local_318[0] != local_308) {
                  operator_delete(local_318[0],local_308[0] + 1);
                }
                printf("%s",local_478);
                fflush(_stdout);
                std::__cxx11::string::_M_append((char *)&local_3b8,(ulong)local_478);
                llama_batch_get_one(&local_1a8,&local_48c,1);
                local_3c8 = local_178;
                local_3f8 = local_1a8;
                uStack_3f0 = auStack_1a0._0_8_;
                local_3e8 = CONCAT71(uStack_197,auStack_1a0[8]);
                uStack_3e0 = uStack_190;
                local_3d8 = local_188;
                uStack_3d0 = uStack_180;
                if (local_478 != &local_468) {
                  operator_delete(local_478,CONCAT71(uStack_467,local_468) + 1);
                }
              }
              printe("failed to convert token to piece\n");
              if (local_478 != &local_468) {
                operator_delete(local_478,CONCAT71(uStack_467,local_468) + 1);
              }
            }
            bVar1 = false;
          }
LAB_00122303:
          if (local_458.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_458.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_458.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_458.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          if (bVar1) {
            printf("\n%s");
            uVar6 = 2;
            if (local_2f8.user._M_string_length == 0) {
              add_message("assistant",&local_3b8,(LlamaData *)local_398);
              uVar6 = apply_chat_template_with_error_handling
                                ((common_chat_templates *)
                                 local_488._M_t.
                                 super__Tuple_impl<0UL,_common_chat_templates_*,_common_chat_templates_deleter>
                                 .super__Head_base<0UL,_common_chat_templates_*,_false>._M_head_impl
                                 ,(LlamaData *)local_398,false,&local_490,local_2f8.use_jinja);
              uVar6 = uVar6 >> 0x1f;
            }
          }
          else {
            printe("failed to generate response\n");
            uVar6 = 1;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
            operator_delete(local_3b8._M_dataplus._M_p,
                            CONCAT71(local_3b8.field_2._M_allocated_capacity._1_7_,
                                     local_3b8.field_2._M_local_buf[0]) + 1);
          }
          if (local_418 != local_408) {
            operator_delete(local_418,local_408[0] + 1);
          }
          if (uVar6 == 1) {
            iVar5 = 1;
            local_494 = 1;
          }
          else if (uVar6 == 2) {
            iVar5 = 3;
          }
          else {
            iVar5 = 0;
          }
        }
LAB_00122415:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438._M_dataplus._M_p != &local_438.field_2) {
          operator_delete(local_438._M_dataplus._M_p,
                          CONCAT71(local_438.field_2._M_allocated_capacity._1_7_,
                                   local_438.field_2._M_local_buf[0]) + 1);
        }
      } while (iVar5 == 0);
      uVar6 = 0;
      if (iVar5 != 3) {
        uVar6 = (uint)(local_494 != 0);
      }
      std::unique_ptr<common_chat_templates,_common_chat_templates_deleter>::~unique_ptr
                ((unique_ptr<common_chat_templates,_common_chat_templates_deleter> *)&local_488);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338._M_dataplus._M_p != &local_338.field_2) {
        operator_delete(local_338._M_dataplus._M_p,
                        CONCAT71(local_338.field_2._M_allocated_capacity._1_7_,
                                 local_338.field_2._M_local_buf[0]) + 1);
      }
    }
    if (vStack_350.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(vStack_350.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)vStack_350.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)vStack_350.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::__cxx11::
    _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_clear(&local_368);
    if (plStack_380 != (pointer)0x0) {
      operator_delete(plStack_380,(long)plStack_370 - (long)plStack_380);
    }
    std::unique_ptr<llama_context,_llama_context_deleter>::~unique_ptr
              ((unique_ptr<llama_context,_llama_context_deleter> *)(local_398 + 0x10));
    std::unique_ptr<llama_sampler,_llama_sampler_deleter>::~unique_ptr
              ((unique_ptr<llama_sampler,_llama_sampler_deleter> *)(local_398 + 8));
    std::unique_ptr<llama_model,_llama_model_deleter>::~unique_ptr
              ((unique_ptr<llama_model,_llama_model_deleter> *)local_398);
  }
  else if (iVar5 != 2) {
    uVar6 = 1;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8.user._M_dataplus._M_p != &local_2f8.user.field_2) {
    operator_delete(local_2f8.user._M_dataplus._M_p,
                    CONCAT71(local_2f8.user.field_2._M_allocated_capacity._1_7_,
                             local_2f8.user.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8.chat_template_file._M_dataplus._M_p != &local_2f8.chat_template_file.field_2) {
    operator_delete(local_2f8.chat_template_file._M_dataplus._M_p,
                    CONCAT71(local_2f8.chat_template_file.field_2._M_allocated_capacity._1_7_,
                             local_2f8.chat_template_file.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8.model_._M_dataplus._M_p != &local_2f8.model_.field_2) {
    operator_delete(local_2f8.model_._M_dataplus._M_p,
                    CONCAT71(local_2f8.model_.field_2._M_allocated_capacity._1_7_,
                             local_2f8.model_.field_2._M_local_buf[0]) + 1);
  }
  return uVar6;
}

Assistant:

int main(int argc, const char ** argv) {
    ctrl_c_handling();
    Opt       opt;
    const int ret = opt.init(argc, argv);
    if (ret == 2) {
        return 0;
    } else if (ret) {
        return 1;
    }

    if (!is_stdin_a_terminal()) {
        if (!opt.user.empty()) {
            opt.user += "\n\n";
        }

        opt.user += read_pipe_data();
    }

    llama_log_set(log_callback, &opt);
    LlamaData llama_data;
    if (llama_data.init(opt)) {
        return 1;
    }

    if (chat_loop(llama_data, opt)) {
        return 1;
    }

    return 0;
}